

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_function.cpp
# Opt level: O2

unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true> __thiscall
duckdb::ParseSubquery(duckdb *this,string *query,ParserOptions *options,string *err_msg)

{
  reference pvVar1;
  pointer pSVar2;
  ParserException *this_00;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_58;
  Parser parser;
  
  Parser::Parser(&parser,*options);
  Parser::ParseQuery(&parser,query);
  if ((long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::get<true>(&parser.statements,0);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(pvVar1);
    if (pSVar2->type == SELECT_STATEMENT) {
      pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
               ::get<true>(&parser.statements,0);
      local_58._M_head_impl =
           (pvVar1->
           super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
           super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
           .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (pvVar1->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
                (this,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)&local_58);
      if (local_58._M_head_impl != (SQLStatement *)0x0) {
        (*(local_58._M_head_impl)->_vptr_SQLStatement[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&parser);
      return (unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>_>)
             (unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>_>)this;
    }
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ParserException::ParserException(this_00,err_msg);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<SubqueryRef> ParseSubquery(const string &query, const ParserOptions &options, const string &err_msg) {
	Parser parser(options);
	parser.ParseQuery(query);
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::SELECT_STATEMENT) {
		throw ParserException(err_msg);
	}
	auto select_stmt = unique_ptr_cast<SQLStatement, SelectStatement>(std::move(parser.statements[0]));
	return duckdb::make_uniq<SubqueryRef>(std::move(select_stmt));
}